

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O0

int Acb_NtkCheckPiOrder(Acb_Ntk_t *pNtkF,Acb_Ntk_t *pNtkG)

{
  int iVar1;
  int iVar2;
  char *__s1;
  char *__s2;
  char *pNameG;
  char *pNameF;
  int nPis;
  int i;
  Acb_Ntk_t *pNtkG_local;
  Acb_Ntk_t *pNtkF_local;
  
  iVar1 = Acb_NtkCiNum(pNtkF);
  pNameF._4_4_ = 0;
  do {
    if (iVar1 <= pNameF._4_4_) {
LAB_00452a34:
      if (pNameF._4_4_ == iVar1) {
        printf("Networks have the same PI names.\n");
      }
      return (int)(pNameF._4_4_ == iVar1);
    }
    iVar2 = Acb_NtkCi(pNtkF,pNameF._4_4_);
    __s1 = Acb_ObjNameStr(pNtkF,iVar2);
    iVar2 = Acb_NtkCi(pNtkG,pNameF._4_4_);
    __s2 = Acb_ObjNameStr(pNtkG,iVar2);
    iVar2 = strcmp(__s1,__s2);
    if (iVar2 != 0) {
      printf("Networks have different PI names. Reordering PIs of the implementation network.\n");
      Acb_NtkUpdateCiOrder(pNtkF,pNtkG);
      goto LAB_00452a34;
    }
    pNameF._4_4_ = pNameF._4_4_ + 1;
  } while( true );
}

Assistant:

int Acb_NtkCheckPiOrder( Acb_Ntk_t * pNtkF, Acb_Ntk_t * pNtkG )
{
    int i, nPis = Acb_NtkCiNum(pNtkF);
    for ( i = 0; i < nPis; i++ )
    {
        char * pNameF = Acb_ObjNameStr( pNtkF, Acb_NtkCi(pNtkF, i) );
        char * pNameG = Acb_ObjNameStr( pNtkG, Acb_NtkCi(pNtkG, i) );
        if ( strcmp(pNameF, pNameG) )
        {
//            printf( "PI %d has different names (%s and %s) in these networks.\n", i, pNameF, pNameG );
            printf( "Networks have different PI names. Reordering PIs of the implementation network.\n" );
            Acb_NtkUpdateCiOrder( pNtkF, pNtkG );
            break;
        }
    }
    if ( i == nPis )
        printf( "Networks have the same PI names.\n" );
    return i == nPis;
}